

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# connector.cpp
# Opt level: O1

int __thiscall sockpp::connector::connect(connector *this,int __fd,sockaddr *__addr,socklen_t __len)

{
  int __fd_00;
  char cVar1;
  int iVar2;
  socklen_t __len_00;
  uint uVar3;
  sockaddr *__addr_00;
  error_category *peVar4;
  undefined8 uVar5;
  int in_register_0000000c;
  int ret;
  int ret_00;
  undefined4 in_register_00000034;
  socket *this_00;
  bool bVar6;
  int err_1;
  error_code err;
  pollfd fds;
  socklen_t len;
  undefined1 local_98 [16];
  error_category *peStack_88;
  undefined4 local_7c;
  error_category *local_78;
  error_category *peStack_70;
  undefined1 local_60 [16];
  error_category *local_50;
  pollfd local_48;
  error_category *local_40;
  socklen_t local_34;
  
  this_00 = (socket *)CONCAT44(in_register_00000034,__fd);
  if (CONCAT44(in_register_0000000c,__len) == 0 || in_register_0000000c < 0) {
    connect(this,__fd,__addr,__len);
    goto LAB_00106e9d;
  }
  recreate((result<sockpp::none> *)this,(connector *)this_00,(sock_address *)__addr);
  if (*(int *)(this + 8) != 0) goto LAB_00106e9d;
  iVar2 = (*this_00->_vptr_socket[4])(this_00);
  if ((char)iVar2 == '\0') {
    (*this_00->_vptr_socket[3])(local_98,this_00,1);
  }
  __fd_00 = this_00->handle_;
  __addr_00 = (sockaddr *)(**(code **)(*(long *)__addr + 0x20))(__addr);
  __len_00 = (**(code **)(*(long *)__addr + 0x10))(__addr);
  uVar3 = ::connect(__fd_00,__addr_00,__len_00);
  socket::check_res<int,int>((result<int> *)local_98,(socket *)(ulong)uVar3,ret);
  if (local_98._8_4_ != 0) {
    local_78 = (error_category *)local_98._8_8_;
    peStack_70 = peStack_88;
    peVar4 = (error_category *)std::_V2::generic_category();
    local_60._0_4_ = 0x73;
    local_60._8_8_ = peVar4;
    cVar1 = (**(code **)(*(long *)peStack_70 + 0x30))(peStack_70,(ulong)local_78 & 0xffffffff);
    if (cVar1 == '\0') {
      cVar1 = (**(code **)(*(long *)local_60._8_8_ + 0x38))(local_60._8_8_,&local_78,local_60._0_4_)
      ;
      if (cVar1 != '\0') goto LAB_00106de3;
      local_48.fd = 0xb;
      local_40 = peVar4;
      cVar1 = (**(code **)(*(long *)peStack_70 + 0x30))(peStack_70,(ulong)local_78 & 0xffffffff);
      if (cVar1 != '\0') goto LAB_00106de3;
      cVar1 = (**(code **)(*(long *)local_40 + 0x38))(local_40,&local_78,local_48.fd);
      if (cVar1 != '\0') goto LAB_00106de3;
    }
    else {
LAB_00106de3:
      local_48.fd = this_00->handle_;
      local_48.events = 5;
      local_48.revents = 0;
      uVar3 = poll(&local_48,1,(int)(CONCAT44(in_register_0000000c,__len) / 1000));
      socket::check_res<int,int>((result<int> *)local_60,(socket *)(ulong)uVar3,ret_00);
      peStack_88 = local_50;
      local_98._0_8_ = CONCAT44(local_60._4_4_,local_60._0_4_);
      local_98._8_8_ = local_60._8_8_;
      uVar5 = local_98._8_8_;
      local_98._8_4_ = (undefined4)local_60._8_8_;
      bVar6 = local_98._8_4_ == 0;
      local_98._8_8_ = uVar5;
      if (bVar6) {
        if ((int)local_60._0_4_ < 1) {
          local_98._0_8_ = (ulong)(uint)local_60._4_4_ << 0x20;
          local_98._12_4_ = SUB84(local_60._8_8_,4);
          local_98._8_4_ = 0x6e;
          peStack_88 = peVar4;
        }
        else {
          local_34 = 4;
          socket::get_option((result<sockpp::none> *)local_60,this_00,1,4,&local_7c,&local_34);
          if (local_60._8_4_ == 0) {
            peStack_88 = (error_category *)std::_V2::system_category();
            local_98._0_8_ = local_98._0_8_ & 0xffffffff00000000;
            local_98._8_4_ = local_7c;
          }
        }
      }
    }
    if (local_98._8_4_ != 0) {
      (*this_00->_vptr_socket[5])(local_60,this_00);
      *(undefined8 *)(this + 8) = local_98._8_8_;
      *(error_category **)(this + 0x10) = peStack_88;
      goto LAB_00106e9d;
    }
  }
  if ((char)iVar2 == '\0') {
    (*this_00->_vptr_socket[3])(local_60,this_00,0);
  }
  *(undefined4 *)(this + 8) = 0;
  uVar5 = std::_V2::system_category();
  *(undefined8 *)(this + 0x10) = uVar5;
LAB_00106e9d:
  return (int)this;
}

Assistant:

result<> connector::connect(const sock_address& addr, microseconds timeout) {
    if (timeout.count() <= 0)
        return connect(addr);

    if (auto res = recreate(addr); !res)
        return res;

    bool non_blocking =
#if defined(_WIN32)
        false;
#else
        is_non_blocking();
#endif

    if (!non_blocking)
        set_non_blocking(true);

    auto res = check_res(::connect(handle(), addr.sockaddr_ptr(), addr.size()));

    if (!res) {
        auto err = res.error();
        if (err == errc::operation_in_progress || err == errc::operation_would_block) {
// TODO: Windows has a WSAPoll() function we can use.
#if defined(_WIN32)
            // Non-blocking connect -- call `select` to wait until the timeout:
            // Note:  Windows returns errors in exceptset so check it too, the
            // logic afterwords doesn't change
            fd_set readset;
            FD_ZERO(&readset);
            FD_SET(handle(), &readset);
            fd_set writeset = readset;
            fd_set exceptset = readset;
            timeval tv = to_timeval(timeout);
            res =
                check_res(::select(int(handle()) + 1, &readset, &writeset, &exceptset, &tv));
#else
            pollfd fds = {handle(), POLLIN | POLLOUT, 0};
            int ms = int(duration_cast<milliseconds>(timeout).count());
            res = check_res(::poll(&fds, 1, ms));
#endif
            if (res) {
                if (res && res.value() > 0) {
                    // Got a socket event, but it might be an error, so check:
                    int err;
                    if (get_option(SOL_SOCKET, SO_ERROR, &err))
                        res = result<int>::from_error(err);
                }
                else {
                    res = errc::timed_out;
                }
            }
        }

        if (!res) {
            close();
            return res.error();
        }
    }

    // Restore blocking mode for socket, if needed.
    if (!non_blocking)
        set_non_blocking(false);

    return none{};
}